

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# censor1.c
# Opt level: O3

int ssh1_censor_packet(PacketLogSettings *pls,int type,_Bool sender_is_client,ptrlen pkt,
                      logblank_t *blanks)

{
  BinarySource *pBVar1;
  int iVar2;
  long lVar3;
  ptrlen pVar4;
  BinarySource src [1];
  BinarySource local_58;
  
  local_58.len = pkt.len;
  local_58.data = pkt.ptr;
  local_58.binarysource_ = &local_58;
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  lVar3 = 0;
  pBVar1 = &local_58;
  if (pls->omit_data == true) {
    pBVar1 = &local_58;
    if (2 < type - 0x10U) {
      pBVar1 = &local_58;
      if (type != 0x17) goto LAB_0011cce8;
      BinarySource_get_uint32(&local_58);
      pBVar1 = local_58.binarysource_;
    }
    local_58.binarysource_ = pBVar1;
    pVar4 = BinarySource_get_string(local_58.binarysource_);
    pBVar1 = local_58.binarysource_;
    if ((local_58.binarysource_)->err == BSE_NO_ERROR) {
      blanks->offset = (int)local_58.pos - (int)pVar4.len;
      blanks->type = 2;
      blanks->len = (int)pVar4.len;
      lVar3 = 1;
    }
  }
LAB_0011cce8:
  local_58.binarysource_ = pBVar1;
  iVar2 = (int)lVar3;
  if (!sender_is_client) {
    return iVar2;
  }
  if (pls->omit_passwords != true) {
    return iVar2;
  }
  if (type < 0x29) {
    if (type != 9) {
      if (type != 0x22) {
        return iVar2;
      }
      BinarySource_get_string(local_58.binarysource_);
      pVar4 = BinarySource_get_string(local_58.binarysource_);
      if ((local_58.binarysource_)->err != BSE_NO_ERROR) {
        return iVar2;
      }
      blanks[lVar3].offset = (int)local_58.pos - (int)pVar4.len;
      blanks[lVar3].type = 1;
      blanks[lVar3].len = (int)pVar4.len;
      goto LAB_0011cd68;
    }
  }
  else if ((type != 0x48) && (type != 0x29)) {
    return iVar2;
  }
  blanks[lVar3].offset = 0;
  blanks[lVar3].len = (int)pkt.len;
  blanks[lVar3].type = 1;
LAB_0011cd68:
  return iVar2 + 1;
}

Assistant:

int ssh1_censor_packet(
    const PacketLogSettings *pls, int type, bool sender_is_client,
    ptrlen pkt, logblank_t *blanks)
{
    int nblanks = 0;
    ptrlen str;
    BinarySource src[1];

    BinarySource_BARE_INIT_PL(src, pkt);

    if (pls->omit_data &&
        (type == SSH1_SMSG_STDOUT_DATA ||
         type == SSH1_SMSG_STDERR_DATA ||
         type == SSH1_CMSG_STDIN_DATA ||
         type == SSH1_MSG_CHANNEL_DATA)) {
        /* "Session data" packets - omit the data string. */
        if (type == SSH1_MSG_CHANNEL_DATA)
            get_uint32(src);           /* skip channel id */
        str = get_string(src);
        if (!get_err(src)) {
            assert(nblanks < MAX_BLANKS);
            blanks[nblanks].offset = src->pos - str.len;
            blanks[nblanks].type = PKTLOG_OMIT;
            blanks[nblanks].len = str.len;
            nblanks++;
        }
    }

    if (sender_is_client && pls->omit_passwords) {
        if (type == SSH1_CMSG_AUTH_PASSWORD ||
            type == SSH1_CMSG_AUTH_TIS_RESPONSE ||
            type == SSH1_CMSG_AUTH_CCARD_RESPONSE) {
            /* If this is a password or similar packet, blank the
             * password(s). */
            assert(nblanks < MAX_BLANKS);
            blanks[nblanks].offset = 0;
            blanks[nblanks].len = pkt.len;
            blanks[nblanks].type = PKTLOG_BLANK;
            nblanks++;
        } else if (type == SSH1_CMSG_X11_REQUEST_FORWARDING) {
            /*
             * If this is an X forwarding request packet, blank the
             * fake auth data.
             *
             * Note that while we blank the X authentication data
             * here, we don't take any special action to blank the
             * start of an X11 channel, so using MIT-MAGIC-COOKIE-1
             * and actually opening an X connection without having
             * session blanking enabled is likely to leak your cookie
             * into the log.
             */
            get_string(src);              /* skip protocol name */
            str = get_string(src);
            if (!get_err(src)) {
                assert(nblanks < MAX_BLANKS);
                blanks[nblanks].offset = src->pos - str.len;
                blanks[nblanks].type = PKTLOG_BLANK;
                blanks[nblanks].len = str.len;
                nblanks++;
            }
        }
    }

    return nblanks;
}